

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::anon_unknown_173::print_rel_only
                   (string *__return_storage_ptr__,Relationship *rel,string *name,uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t indent_00;
  uint32_t n;
  char *pcVar5;
  stringstream ss;
  string sStack_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar3 = indent;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = ::std::operator<<(local_1a8,"rel ");
  ::std::operator<<(poVar2,(string *)name);
  uVar4 = 0x341158;
  indent_00 = 0x341158;
  switch(rel->type) {
  case DefineOnly:
    break;
  case Path:
    indent_00 = uVar4;
    poVar2 = ::std::operator<<(local_1a8," = ");
    ::std::operator<<(poVar2,&rel->targetPath);
    break;
  case PathVector:
    indent_00 = uVar4;
    poVar2 = ::std::operator<<(local_1a8," = ");
    ::std::operator<<(poVar2,&rel->targetPathVector);
    break;
  case ValueBlock:
    pcVar5 = " = None";
    indent_00 = uVar4;
    goto LAB_00249437;
  default:
    pcVar5 = "[InternalErrror]";
    indent_00 = uVar3;
LAB_00249437:
    ::std::operator<<(local_1a8,pcVar5);
  }
  bVar1 = AttrMetas::authored(&rel->_metas);
  if (bVar1) {
    poVar2 = ::std::operator<<(local_1a8," (\n");
    print_attr_metas_abi_cxx11_
              (&local_1d8,(tinyusdz *)&rel->_metas,(AttrMeta *)(ulong)(indent + 1),indent_00);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_1d8);
    pprint::Indent_abi_cxx11_(&sStack_1f8,(pprint *)(ulong)indent,n);
    poVar2 = ::std::operator<<(poVar2,(string *)&sStack_1f8);
    ::std::operator<<(poVar2,")");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::operator<<(local_1a8,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_rel_only(const Relationship &rel, const std::string &name,
                           uint32_t indent) {
  std::stringstream ss;

  ss << "rel " << name;

  if (!rel.has_value()) {
    // nothing todo
  } else if (rel.is_path()) {
    ss << " = " << rel.targetPath;
  } else if (rel.is_pathvector()) {
    ss << " = " << rel.targetPathVector;
  } else if (rel.is_blocked()) {
    ss << " = None";
  } else {
    ss << "[InternalErrror]";
  }

  if (rel.metas().authored()) {
    ss << " (\n"
       << print_attr_metas(rel.metas(), indent + 1) << pprint::Indent(indent)
       << ")";
  }

  ss << "\n";

  return ss.str();
}